

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O3

int base64_decode_quad(uint8_t *out,size_t *out_num_bytes,uint8_t *in)

{
  uint8_t a;
  uint8_t a_00;
  uint8_t a_01;
  uint8_t a_02;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  byte bVar6;
  
  a = *in;
  bVar1 = base64_ascii_to_bin(a);
  a_00 = in[1];
  bVar2 = base64_ascii_to_bin(a_00);
  a_01 = in[2];
  bVar3 = base64_ascii_to_bin(a_01);
  a_02 = in[3];
  bVar4 = base64_ascii_to_bin(a_02);
  iVar5 = 0;
  if ((bVar4 != 0xff && bVar3 != 0xff) && (bVar2 != 0xff && bVar1 != 0xff)) {
    bVar1 = (byte)(((uint)bVar2 << 0xc) >> 0x10) | (byte)(((uint)bVar1 << 0x12) >> 0x10);
    bVar6 = a_02 == '=' | (a == '=') * '\b' + (a_00 == '=') * '\x04' + (a_01 == '=') * '\x02';
    if (bVar6 == 3) {
      *out_num_bytes = 1;
      *out = bVar1;
    }
    else {
      bVar2 = (byte)(((uint)bVar3 << 6) >> 8) | (byte)(((uint)bVar2 << 0xc) >> 8);
      if (bVar6 == 1) {
        *out_num_bytes = 2;
        *out = bVar1;
        out[1] = bVar2;
      }
      else {
        if (bVar6 != 0) {
          return 0;
        }
        *out_num_bytes = 3;
        *out = bVar1;
        out[1] = bVar2;
        out[2] = (byte)((uint)bVar3 << 6) | bVar4;
      }
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int base64_decode_quad(uint8_t *out, size_t *out_num_bytes,
                              const uint8_t *in) {
  const uint8_t a = base64_ascii_to_bin(in[0]);
  const uint8_t b = base64_ascii_to_bin(in[1]);
  const uint8_t c = base64_ascii_to_bin(in[2]);
  const uint8_t d = base64_ascii_to_bin(in[3]);
  if (a == 0xff || b == 0xff || c == 0xff || d == 0xff) {
    return 0;
  }

  const uint32_t v = ((uint32_t)a) << 18 | ((uint32_t)b) << 12 |
                     ((uint32_t)c) << 6 | (uint32_t)d;

  const unsigned padding_pattern = (in[0] == '=') << 3 | //
                                   (in[1] == '=') << 2 | //
                                   (in[2] == '=') << 1 | //
                                   (in[3] == '=');

  // In presence of padding, the lowest bits of v are unused. Canonical encoding
  // (RFC 4648, section 3.5) requires that these bits all be set to zero. Common
  // PEM parsers accept noncanonical base64, adding to the malleability of the
  // format. This decoder follows OpenSSL's and Go's PEM parsers and accepts it.
  switch (padding_pattern) {
    case 0:
      // The common case of no padding.
      *out_num_bytes = 3;
      out[0] = v >> 16;
      out[1] = v >> 8;
      out[2] = v;
      break;

    case 1:  // xxx=
      *out_num_bytes = 2;
      out[0] = v >> 16;
      out[1] = v >> 8;
      break;

    case 3:  // xx==
      *out_num_bytes = 1;
      out[0] = v >> 16;
      break;

    default:
      return 0;
  }

  return 1;
}